

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

void phys_page_set_level(PhysPageMap *map,PhysPageEntry *lp,hwaddr *index,uint64_t *nb,uint16_t leaf
                        ,int level)

{
  PhysPageEntry *lp_00;
  uint uVar1;
  Node *paPVar2;
  byte bVar3;
  long lVar4;
  ulong uVar5;
  PhysPageEntry PVar6;
  ulong uVar7;
  
  bVar3 = (char)level * '\t';
  uVar7 = 1L << (bVar3 & 0x3f);
  PVar6 = *lp;
  if (0xffffffbf < (uint)PVar6 && ((uint)PVar6 & 0x3f) != 0) {
    uVar1 = map->nodes_nb;
    paPVar2 = map->nodes;
    map->nodes_nb = uVar1 + 1;
    if ((ulong)uVar1 == 0x3ffffff) {
      __assert_fail("ret != PHYS_MAP_NODE_NIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                    ,0x85,"uint32_t phys_map_node_alloc(PhysPageMap *, _Bool)");
    }
    if (uVar1 == map->nodes_nb_alloc) {
      __assert_fail("ret != map->nodes_nb_alloc",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                    ,0x86,"uint32_t phys_map_node_alloc(PhysPageMap *, _Bool)");
    }
    for (lVar4 = 0; lVar4 != 0x200; lVar4 = lVar4 + 1) {
      paPVar2[uVar1][lVar4] =
           (PhysPageEntry)((uint)(level == 0) * 0x40 + (uint)(level != 0) + -0x40);
    }
    PVar6 = (PhysPageEntry)((uint)*lp & 0x3f | uVar1 << 6);
    *lp = PVar6;
  }
  paPVar2 = map->nodes;
  for (uVar5 = (ulong)(((uint)(*index >> (bVar3 & 0x3f)) & 0x1ff) << 2);
      (*nb != 0 && (uVar5 < 0x800)); uVar5 = uVar5 + 4) {
    lp_00 = (PhysPageEntry *)(&paPVar2[(uint)PVar6 >> 6][0].field_0x0 + uVar5);
    if (*nb < uVar7 || (*index & uVar7 - 1) != 0) {
      phys_page_set_level(map,lp_00,index,nb,leaf,level + -1);
    }
    else {
      *lp_00 = (PhysPageEntry)((uint)leaf << 6);
      *index = *index + uVar7;
      *nb = *nb - uVar7;
    }
  }
  return;
}

Assistant:

static void phys_page_set_level(PhysPageMap *map, PhysPageEntry *lp,
                                hwaddr *index, uint64_t *nb, uint16_t leaf,
                                int level)
{
    PhysPageEntry *p;
    hwaddr step = (hwaddr)1 << (level * P_L2_BITS);

    if (lp->skip && lp->ptr == PHYS_MAP_NODE_NIL) {
        lp->ptr = phys_map_node_alloc(map, level == 0);
    }
    p = map->nodes[lp->ptr];
    lp = &p[(*index >> (level * P_L2_BITS)) & (P_L2_SIZE - 1)];

    while (*nb && lp < &p[P_L2_SIZE]) {
        if ((*index & (step - 1)) == 0 && *nb >= step) {
            lp->skip = 0;
            lp->ptr = leaf;
            *index += step;
            *nb -= step;
        } else {
            phys_page_set_level(map, lp, index, nb, leaf, level - 1);
        }
        ++lp;
    }
}